

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O0

HRESULT utf8::NarrowStringToWide<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCSTR sourceString,size_t sourceCount,
                  LPWSTR *destStringPtr,charcount_t *destCount,size_t *allocateCount)

{
  ulong uVar1;
  LPWSTR destString_00;
  WCHAR *destString;
  size_t cbDestString;
  size_t *allocateCount_local;
  charcount_t *destCount_local;
  LPWSTR *destStringPtr_local;
  size_t sourceCount_local;
  LPCSTR sourceString_local;
  _func_void_ptr_unsigned_long *allocator_local;
  
  uVar1 = (sourceCount + 1) * 2;
  if (uVar1 < sourceCount) {
    allocator_local._4_4_ = -0x7ff8fff2;
  }
  else {
    destString_00 = (LPWSTR)(*allocator)(uVar1);
    if (destString_00 == (LPWSTR)0x0) {
      allocator_local._4_4_ = -0x7ff8fff2;
    }
    else {
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = uVar1;
      }
      *destStringPtr = destString_00;
      allocator_local._4_4_ =
           NarrowStringToWideNoAlloc
                     (sourceString,sourceCount,destString_00,sourceCount + 1,destCount);
    }
  }
  return allocator_local._4_4_;
}

Assistant:

HRESULT NarrowStringToWide(_In_ AllocatorFunction allocator,_In_ LPCSTR sourceString,
        size_t sourceCount, _Out_ LPWSTR* destStringPtr, _Out_ charcount_t* destCount, size_t* allocateCount = nullptr)
    {
        size_t cbDestString = (sourceCount + 1) * sizeof(WCHAR);
        if (cbDestString < sourceCount) // overflow ?
        {
            return E_OUTOFMEMORY;
        }

        WCHAR* destString = (WCHAR*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        if (allocateCount != nullptr)
        {
            *allocateCount = cbDestString;
        }

        *destStringPtr = destString;
        return NarrowStringToWideNoAlloc(sourceString, sourceCount, destString, sourceCount + 1, destCount);
    }